

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O0

bool spvtools::utils::
     ParseNumber<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>>
               (char *text,
               HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
               *value_pointer)

{
  bool bVar1;
  _Setbase _Var2;
  byte local_1da;
  byte local_1d9;
  byte local_1ca;
  bool local_1c9;
  bool ok;
  string local_1c0 [32];
  istringstream local_1a0 [8];
  istringstream text_stream;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  *value_pointer_local;
  char *text_local;
  
  if (text == (char *)0x0) {
    text_local._7_1_ = false;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1c0,text,(allocator<char> *)&ok);
    std::__cxx11::istringstream::istringstream(local_1a0,local_1c0,_S_in);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&ok);
    _Var2 = std::setbase(0);
    std::operator>>((istream *)local_1a0,_Var2);
    operator>>((istream *)local_1a0,value_pointer);
    local_1ca = 0;
    if (*text != '\0') {
      local_1ca = std::ios::bad();
      local_1ca = local_1ca ^ 0xff;
    }
    local_1d9 = 0;
    if ((local_1ca & 1) != 0) {
      local_1d9 = std::ios::eof();
    }
    local_1da = 0;
    if ((local_1d9 & 1) != 0) {
      local_1da = std::ios::fail();
      local_1da = local_1da ^ 0xff;
    }
    local_1c9 = (bool)(local_1da & 1);
    if ((local_1c9 != false) && (*text == '-')) {
      bVar1 = ClampToZeroIfUnsignedType<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>,_void>
              ::Clamp(value_pointer);
      local_1c9 = (bool)((bVar1 ^ 0xffU) & 1);
    }
    text_local._7_1_ = local_1c9;
    std::__cxx11::istringstream::~istringstream(local_1a0);
  }
  return text_local._7_1_;
}

Assistant:

bool ParseNumber(const char* text, T* value_pointer) {
  // C++11 doesn't define std::istringstream(int8_t&), so calling this method
  // with a single-byte type leads to implementation-defined behaviour.
  // Similarly for uint8_t.
  static_assert(sizeof(T) > 1,
                "Single-byte types are not supported in this parse method");

  if (!text) return false;
  std::istringstream text_stream(text);
  // Allow both decimal and hex input for integers.
  // It also allows octal input, but we don't care about that case.
  text_stream >> std::setbase(0);
  text_stream >> *value_pointer;

  // We should have read something.
  bool ok = (text[0] != 0) && !text_stream.bad();
  // It should have been all the text.
  ok = ok && text_stream.eof();
  // It should have been in range.
  ok = ok && !text_stream.fail();

  // Work around a bug in the GNU C++11 library. It will happily parse
  // "-1" for uint16_t as 65535.
  if (ok && text[0] == '-')
    ok = !ClampToZeroIfUnsignedType<T>::Clamp(value_pointer);

  return ok;
}